

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

string * __thiscall
Parse::toSymTypeName_abi_cxx11_(string *__return_storage_ptr__,Parse *this,Type *type)

{
  Type TVar1;
  char *pcVar2;
  char *pcVar3;
  
  TVar1 = *type;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(TVar1) {
  case INT:
    pcVar3 = "int";
    pcVar2 = "";
    break;
  case DOUBLE:
    pcVar3 = "double";
    pcVar2 = "";
    break;
  case CHAR:
    pcVar3 = "char";
    pcVar2 = "";
    break;
  case BOOL:
    pcVar3 = "bool";
    pcVar2 = "";
    break;
  case ARRAY:
    pcVar3 = "arr";
    pcVar2 = "";
    break;
  default:
    pcVar2 = "";
    pcVar3 = pcVar2;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

string Parse::toSymTypeName(Type &type) {

    if(type == Type::INT) {
        return "int";
    } else if(type == Type::BOOL) {
        return "bool";
    } else if(type == Type::CHAR) {
        return "char";
    } else if(type == Type::DOUBLE) {
        return "double";
    } else if(type == Type::ARRAY) {
        return "arr";
    }
    return "";
}